

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  u8 uVar1;
  sqlite3 *db;
  u8 *puVar2;
  u32 uVar3;
  u32 uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  code *xDel;
  uint uVar10;
  uint uVar11;
  u32 uVar12;
  i64 iVal;
  u32 n;
  u8 *z;
  long in_FS_OFFSET;
  int iStack_140;
  double r;
  u32 local_10c;
  JsonParse local_108;
  sqlite3_int64 iRes;
  char *local_b8;
  u64 local_b0;
  u64 local_a8;
  undefined8 local_a0;
  undefined1 *puStack_98;
  undefined1 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_10c = 0xaaaaaaaa;
  db = pCtx->pOut->db;
  uVar4 = jsonbPayloadSize(pParse,i,&local_10c);
  uVar3 = local_10c;
  if (uVar4 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3_result_error(pCtx,"malformed JSON",-1);
      return;
    }
    goto LAB_001a6853;
  }
  puVar2 = pParse->aBlob;
  uVar11 = local_10c;
  switch(puVar2[i] & 0xf) {
  case 0:
    if (local_10c == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3_result_null(pCtx);
        return;
      }
      goto LAB_001a6853;
    }
    break;
  case 1:
    if (local_10c == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        iVar5 = 1;
LAB_001a67f9:
        sqlite3_result_int(pCtx,iVar5);
        return;
      }
      goto LAB_001a6853;
    }
    break;
  case 2:
    if (local_10c == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        iVar5 = 0;
        goto LAB_001a67f9;
      }
      goto LAB_001a6853;
    }
    break;
  case 3:
  case 4:
    iRes = 0;
    if (local_10c == 0) break;
    uVar6 = (ulong)(uVar4 + i);
    uVar1 = puVar2[uVar6];
    if (uVar1 == '-') {
      if (local_10c == 1) break;
      uVar6 = (ulong)(uVar4 + i + 1);
      uVar4 = uVar4 + 1;
      uVar11 = local_10c - 1;
    }
    pcVar7 = sqlite3DbStrNDup(db,(char *)(puVar2 + uVar6),(long)(int)uVar11);
    if (pcVar7 == (char *)0x0) goto LAB_001a676e;
    iVar5 = sqlite3DecOrHexToI64(pcVar7,&iRes);
    sqlite3DbFreeNN(db,pcVar7);
    if (iVar5 == 0) {
      iVal = -iRes;
      if (uVar1 != '-') {
        iVal = iRes;
      }
    }
    else {
      if ((uVar1 != '-') || (iVar5 != 3)) {
        if ((uVar1 == '-') && (iVar5 != 1)) {
          uVar4 = uVar4 - 1;
          uVar11 = uVar11 + 1;
        }
        else if (iVar5 == 1) break;
LAB_001a63c6:
        pcVar7 = sqlite3DbStrNDup(db,(char *)(pParse->aBlob + (uVar4 + i)),(long)(int)uVar11);
        if (pcVar7 != (char *)0x0) {
          iVar5 = sqlite3Strlen30(pcVar7);
          iVar5 = sqlite3AtoF(pcVar7,&r,iVar5,'\x01');
          sqlite3DbFreeNN(db,pcVar7);
          if (0 < iVar5) {
            sqlite3_result_double(pCtx,r);
            goto LAB_001a6778;
          }
          break;
        }
        goto LAB_001a676e;
      }
      iVal = -0x8000000000000000;
    }
    sqlite3_result_int64(pCtx,iVal);
    goto LAB_001a6778;
  case 5:
  case 6:
    r = -NAN;
    if (local_10c != 0) goto LAB_001a63c6;
    break;
  case 7:
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      z = puVar2 + (uVar4 + i);
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
      n = local_10c;
LAB_001a666b:
      sqlite3_result_text(pCtx,(char *)z,n,xDel);
      return;
    }
    goto LAB_001a6853;
  case 8:
  case 9:
    z = (u8 *)sqlite3DbMallocRaw(db,(ulong)(local_10c + 1));
    if (z != (u8 *)0x0) {
      uVar11 = 0;
      n = 0;
      while( true ) {
        uVar12 = uVar3 - uVar11;
        if (uVar3 < uVar11 || uVar12 == 0) break;
        if (puVar2[(ulong)uVar11 + (ulong)(uVar4 + i)] == '\\') {
          iRes = CONCAT44(iRes._4_4_,0xaaaaaaaa);
          uVar12 = jsonUnescapeOneChar((char *)(puVar2 + (ulong)uVar11 + (ulong)(uVar4 + i)),uVar12,
                                       (u32 *)&iRes);
          if ((uint)iRes < 0x80) {
            iStack_140 = 1;
            uVar10 = n;
            uVar9 = (uint)iRes;
LAB_001a6629:
            n = n + iStack_140;
            z[uVar10] = (u8)uVar9;
          }
          else {
            bVar8 = (byte)iRes;
            if ((uint)iRes < 0x800) {
              uVar10 = n + 1;
              z[n] = (byte)((uint)iRes >> 6) | 0xc0;
              uVar9 = (uint)(bVar8 & 0x3f | 0x80);
              iStack_140 = 2;
              goto LAB_001a6629;
            }
            if ((uint)iRes < 0x10000) {
              z[n] = (byte)((uint)iRes >> 0xc) | 0xe0;
              uVar10 = n + 2;
              z[n + 1] = (byte)((uint)iRes >> 6) & 0x3f | 0x80;
              uVar9 = (uint)(bVar8 & 0x3f | 0x80);
              iStack_140 = 3;
              goto LAB_001a6629;
            }
            if ((uint)iRes != 0x99999) {
              z[n] = (byte)((uint)iRes >> 0x12) | 0xf0;
              z[n + 1] = (byte)((uint)iRes >> 0xc) & 0x3f | 0x80;
              uVar10 = n + 3;
              z[n + 2] = (byte)((uint)iRes >> 6) & 0x3f | 0x80;
              uVar9 = (uint)(bVar8 & 0x3f | 0x80);
              iStack_140 = 4;
              goto LAB_001a6629;
            }
          }
          uVar11 = (uVar11 + uVar12) - 1;
        }
        else {
          z[n] = puVar2[(ulong)uVar11 + (ulong)(uVar4 + i)];
          n = n + 1;
        }
        uVar11 = uVar11 + 1;
      }
      z[n] = '\0';
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        xDel = sqlite3OomClear;
        goto LAB_001a666b;
      }
      goto LAB_001a6853;
    }
LAB_001a676e:
    sqlite3_result_error_nomem(pCtx);
    goto LAB_001a6778;
  case 0xb:
  case 0xc:
    if ((textOnly == 0) && (((ulong)pCtx->pFunc->pUserData & 8) != 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3_result_blob(pCtx,puVar2 + i,local_10c + uVar4,
                            (_func_void_void_ptr *)0xffffffffffffffff);
        return;
      }
      goto LAB_001a6853;
    }
    local_b8 = (char *)((long)&local_a0 + 2);
    puStack_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_108.zJson = (char *)0x0;
    local_108.db = (sqlite3 *)0x0;
    local_108.nJson = 0;
    local_108.nJPRef = 0;
    local_108.iErr = 0;
    local_108.iDepth = 0;
    local_108.nErr = '\0';
    local_108.oom = '\0';
    local_108.bJsonIsRCStr = '\0';
    local_108.hasNonstd = '\0';
    local_108.bReadOnly = '\0';
    local_108.eEdit = '\0';
    local_108.delta = 0;
    local_108.nIns = 0;
    local_108.iLabel = 0;
    local_108.aIns = (u8 *)0x0;
    local_108.nBlobAlloc = 0;
    local_108.nBlob = local_10c + uVar4;
    local_b0 = 100;
    local_a8 = 0;
    local_a0._0_1_ = '\x01';
    local_a0._1_1_ = '\0';
    local_a0._2_1_ = -0x56;
    local_a0._3_1_ = -0x56;
    local_a0._4_1_ = -0x56;
    local_a0._5_1_ = -0x56;
    local_a0._6_1_ = -0x56;
    local_a0._7_1_ = -0x56;
    local_108.aBlob = puVar2 + i;
    iRes = (sqlite3_int64)pCtx;
    jsonTranslateBlobToText(&local_108,0,(JsonString *)&iRes);
    jsonReturnString((JsonString *)&iRes,(JsonParse *)0x0,(sqlite3_context *)0x0);
    goto LAB_001a6778;
  }
  sqlite3_result_error(pCtx,"malformed JSON",-1);
LAB_001a6778:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001a6853:
  __stack_chk_fail();
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}